

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_base64_encode(uchar *src,size_t src_len,char *dst,size_t *dst_len)

{
  byte bVar1;
  ulong uVar2;
  uint local_60;
  uint local_5c;
  size_t expected_len;
  int c;
  int b;
  int a;
  size_t j;
  size_t i;
  size_t *dst_len_local;
  char *dst_local;
  size_t src_len_local;
  uchar *src_local;
  
  if ((dst_len == (size_t *)0x0) || (uVar2 = ((src_len + 2) / 3) * 4 + 1, uVar2 <= *dst_len)) {
    _b = 0;
    for (j = 0; j < src_len; j = j + 3) {
      bVar1 = src[j];
      if (j + 1 < src_len) {
        local_5c = (uint)src[j + 1];
      }
      else {
        local_5c = 0;
      }
      if (j + 2 < src_len) {
        local_60 = (uint)src[j + 2];
      }
      else {
        local_60 = 0;
      }
      dst[_b] = mg_base64_encode::b64[(int)(uint)bVar1 >> 2];
      dst[_b + 1] = mg_base64_encode::b64[(int)((bVar1 & 3) << 4 | (int)local_5c >> 4)];
      uVar2 = _b + 2;
      if (j + 1 < src_len) {
        dst[_b + 2] = mg_base64_encode::b64[(int)((local_5c & 0xf) << 2 | (int)local_60 >> 6)];
        uVar2 = _b + 3;
      }
      _b = uVar2;
      if (j + 2 < src_len) {
        dst[_b] = mg_base64_encode::b64[(int)(local_60 & 0x3f)];
        _b = _b + 1;
      }
    }
    while ((_b & 3) != 0) {
      dst[_b] = '=';
      _b = _b + 1;
    }
    dst[_b] = '\0';
    if (dst_len != (size_t *)0x0) {
      *dst_len = _b + 1;
    }
    src_local._4_4_ = -1;
  }
  else {
    if (*dst_len != 0) {
      *dst = '\0';
    }
    *dst_len = uVar2;
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_base64_encode(const unsigned char *src,
                 size_t src_len,
                 char *dst,
                 size_t *dst_len)
{
	static const char *b64 =
	    "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
	size_t i, j;
	int a, b, c;

	if (dst_len != NULL) {
		/* Expected length including 0 termination: */
		/* IN 1 -> OUT 5, IN 2 -> OUT 5, IN 3 -> OUT 5, IN 4 -> OUT 9,
		 * IN 5 -> OUT 9, IN 6 -> OUT 9, IN 7 -> OUT 13, etc. */
		size_t expected_len = ((src_len + 2) / 3) * 4 + 1;
		if (*dst_len < expected_len) {
			if (*dst_len > 0) {
				dst[0] = '\0';
			}
			*dst_len = expected_len;
			return 0;
		}
	}

	for (i = j = 0; i < src_len; i += 3) {
		a = src[i];
		b = ((i + 1) >= src_len) ? 0 : src[i + 1];
		c = ((i + 2) >= src_len) ? 0 : src[i + 2];

		dst[j++] = b64[a >> 2];
		dst[j++] = b64[((a & 3) << 4) | (b >> 4)];
		if (i + 1 < src_len) {
			dst[j++] = b64[(b & 15) << 2 | (c >> 6)];
		}
		if (i + 2 < src_len) {
			dst[j++] = b64[c & 63];
		}
	}
	while (j % 4 != 0) {
		dst[j++] = '=';
	}
	dst[j++] = '\0';

	if (dst_len != NULL) {
		*dst_len = (size_t)j;
	}

	/* Return -1 for "OK" */
	return -1;
}